

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstracttestlogger.cpp
# Opt level: O3

void __thiscall QAbstractTestLogger::outputString(QAbstractTestLogger *this,char *msg)

{
  byte bVar1;
  byte *pbVar2;
  size_t sVar3;
  byte *__dest;
  
  if (this->stream == (FILE *)0x0) {
    outputString();
  }
  else if (msg != (char *)0x0) {
    sVar3 = strlen(msg);
    __dest = (byte *)operator_new__(sVar3 + 1);
    strcpy((char *)__dest,msg);
    bVar1 = *__dest;
    pbVar2 = __dest;
    while (bVar1 != 0) {
      if ((bVar1 == 0x7f) || (bVar1 < 0x20 && (byte)(bVar1 - 0xb) < 0xfe)) {
        *pbVar2 = 0x3f;
      }
      bVar1 = pbVar2[1];
      pbVar2 = pbVar2 + 1;
    }
    fputs((char *)__dest,(FILE *)this->stream);
    fflush((FILE *)this->stream);
    operator_delete__(__dest);
    return;
  }
  outputString();
  return;
}

Assistant:

void QAbstractTestLogger::outputString(const char *msg)
{
    QTEST_ASSERT(stream);
    QTEST_ASSERT(msg);

    char *filtered = new char[strlen(msg) + 1];
    strcpy(filtered, msg);
    filterUnprintable(filtered);

    ::fputs(filtered, stream);
    ::fflush(stream);

    delete [] filtered;
}